

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O3

void __thiscall duckdb::UpdateSegment::UpdateSegment(UpdateSegment *this,ColumnData *column_data)

{
  PhysicalType type;
  Allocator *allocator;
  idx_t iVar1;
  code *pcVar2;
  NotImplementedException *this_00;
  code *pcVar3;
  code *pcVar4;
  code *pcVar5;
  code *pcVar6;
  code *pcVar7;
  code *pcVar8;
  LogicalType local_68;
  string local_50;
  
  this->column_data = column_data;
  StorageLock::StorageLock(&this->lock);
  (this->root).super_unique_ptr<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::UpdateNode,_std::default_delete<duckdb::UpdateNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::UpdateNode_*,_std::default_delete<duckdb::UpdateNode>_>.
  super__Head_base<0UL,_duckdb::UpdateNode_*,_false>._M_head_impl = (UpdateNode *)0x0;
  LogicalType::LogicalType(&local_68,&column_data->type);
  SegmentStatistics::SegmentStatistics(&this->stats,&local_68);
  LogicalType::~LogicalType(&local_68);
  *(undefined8 *)((long)&(this->stats_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->stats_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->stats_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->stats_lock).super___mutex_base._M_mutex + 8) = 0;
  (this->stats_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  allocator = BufferAllocator::Get(column_data->info->db->db);
  StringHeap::StringHeap(&this->heap,allocator);
  type = (column_data->type).physical_type_;
  iVar1 = GetTypeIdSize(type);
  this->type_size = iVar1;
  switch(type) {
  case BOOL:
  case INT8:
    this->initialize_update_function = InitializeUpdateData<signed_char>;
    if (type != UINT8) {
      pcVar2 = TemplatedUpdateNumericStatistics<signed_char>;
      pcVar3 = RollbackUpdate<signed_char>;
      pcVar4 = MergeUpdateLoop<signed_char>;
      pcVar5 = TemplatedFetchRow<signed_char>;
      pcVar6 = TemplatedFetchCommittedRange<signed_char>;
      pcVar7 = TemplatedFetchCommitted<signed_char>;
      pcVar8 = UpdateMergeFetch<signed_char>;
      break;
    }
    goto LAB_0178cace;
  case UINT8:
    this->initialize_update_function = InitializeUpdateData<unsigned_char>;
LAB_0178cace:
    pcVar2 = TemplatedUpdateNumericStatistics<unsigned_char>;
    pcVar3 = RollbackUpdate<unsigned_char>;
    pcVar4 = MergeUpdateLoop<unsigned_char>;
    pcVar5 = TemplatedFetchRow<unsigned_char>;
    pcVar6 = TemplatedFetchCommittedRange<unsigned_char>;
    pcVar7 = TemplatedFetchCommitted<unsigned_char>;
    pcVar8 = UpdateMergeFetch<unsigned_char>;
    break;
  case UINT16:
    this->initialize_update_function = InitializeUpdateData<unsigned_short>;
    pcVar2 = TemplatedUpdateNumericStatistics<unsigned_short>;
    pcVar3 = RollbackUpdate<unsigned_short>;
    pcVar4 = MergeUpdateLoop<unsigned_short>;
    pcVar5 = TemplatedFetchRow<unsigned_short>;
    pcVar6 = TemplatedFetchCommittedRange<unsigned_short>;
    pcVar7 = TemplatedFetchCommitted<unsigned_short>;
    pcVar8 = UpdateMergeFetch<unsigned_short>;
    break;
  case INT16:
    this->initialize_update_function = InitializeUpdateData<short>;
    pcVar2 = TemplatedUpdateNumericStatistics<short>;
    pcVar3 = RollbackUpdate<short>;
    pcVar4 = MergeUpdateLoop<short>;
    pcVar5 = TemplatedFetchRow<short>;
    pcVar6 = TemplatedFetchCommittedRange<short>;
    pcVar7 = TemplatedFetchCommitted<short>;
    pcVar8 = UpdateMergeFetch<short>;
    break;
  case UINT32:
    this->initialize_update_function = InitializeUpdateData<unsigned_int>;
    pcVar2 = TemplatedUpdateNumericStatistics<unsigned_int>;
    pcVar3 = RollbackUpdate<unsigned_int>;
    pcVar4 = MergeUpdateLoop<unsigned_int>;
    pcVar5 = TemplatedFetchRow<unsigned_int>;
    pcVar6 = TemplatedFetchCommittedRange<unsigned_int>;
    pcVar7 = TemplatedFetchCommitted<unsigned_int>;
    pcVar8 = UpdateMergeFetch<unsigned_int>;
    break;
  case INT32:
    this->initialize_update_function = InitializeUpdateData<int>;
    pcVar2 = TemplatedUpdateNumericStatistics<int>;
    pcVar3 = RollbackUpdate<int>;
    pcVar4 = MergeUpdateLoop<int>;
    pcVar5 = TemplatedFetchRow<int>;
    pcVar6 = TemplatedFetchCommittedRange<int>;
    pcVar7 = TemplatedFetchCommitted<int>;
    pcVar8 = UpdateMergeFetch<int>;
    break;
  case UINT64:
    this->initialize_update_function = InitializeUpdateData<unsigned_long>;
    pcVar2 = TemplatedUpdateNumericStatistics<unsigned_long>;
    pcVar3 = RollbackUpdate<unsigned_long>;
    pcVar4 = MergeUpdateLoop<unsigned_long>;
    pcVar5 = TemplatedFetchRow<unsigned_long>;
    pcVar6 = TemplatedFetchCommittedRange<unsigned_long>;
    pcVar7 = TemplatedFetchCommitted<unsigned_long>;
    pcVar8 = UpdateMergeFetch<unsigned_long>;
    break;
  case INT64:
    this->initialize_update_function = InitializeUpdateData<long>;
    pcVar2 = TemplatedUpdateNumericStatistics<long>;
    pcVar3 = RollbackUpdate<long>;
    pcVar4 = MergeUpdateLoop<long>;
    pcVar5 = TemplatedFetchRow<long>;
    pcVar6 = TemplatedFetchCommittedRange<long>;
    pcVar7 = TemplatedFetchCommitted<long>;
    pcVar8 = UpdateMergeFetch<long>;
    break;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
switchD_0178c8fb_caseD_a:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Unimplemented type for update segment","");
    NotImplementedException::NotImplementedException(this_00,&local_50);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    this->initialize_update_function = InitializeUpdateData<float>;
    pcVar2 = TemplatedUpdateNumericStatistics<float>;
    pcVar3 = RollbackUpdate<float>;
    pcVar4 = MergeUpdateLoop<float>;
    pcVar5 = TemplatedFetchRow<float>;
    pcVar6 = TemplatedFetchCommittedRange<float>;
    pcVar7 = TemplatedFetchCommitted<float>;
    pcVar8 = UpdateMergeFetch<float>;
    break;
  case DOUBLE:
    this->initialize_update_function = InitializeUpdateData<double>;
    pcVar2 = TemplatedUpdateNumericStatistics<double>;
    pcVar3 = RollbackUpdate<double>;
    pcVar4 = MergeUpdateLoop<double>;
    pcVar5 = TemplatedFetchRow<double>;
    pcVar6 = TemplatedFetchCommittedRange<double>;
    pcVar7 = TemplatedFetchCommitted<double>;
    pcVar8 = UpdateMergeFetch<double>;
    break;
  case INTERVAL:
    this->initialize_update_function = InitializeUpdateData<duckdb::interval_t>;
    pcVar2 = TemplatedUpdateNumericStatistics<duckdb::interval_t>;
    pcVar3 = RollbackUpdate<duckdb::interval_t>;
    pcVar4 = MergeUpdateLoop<duckdb::interval_t>;
    pcVar5 = TemplatedFetchRow<duckdb::interval_t>;
    pcVar6 = TemplatedFetchCommittedRange<duckdb::interval_t>;
    pcVar7 = TemplatedFetchCommitted<duckdb::interval_t>;
    pcVar8 = UpdateMergeFetch<duckdb::interval_t>;
    break;
  default:
    switch(type) {
    case VARCHAR:
      this->initialize_update_function = InitializeUpdateData<duckdb::string_t>;
      pcVar2 = UpdateStringStatistics;
      pcVar3 = RollbackUpdate<duckdb::string_t>;
      pcVar4 = MergeUpdateLoop<duckdb::string_t>;
      pcVar5 = TemplatedFetchRow<duckdb::string_t>;
      pcVar6 = TemplatedFetchCommittedRange<duckdb::string_t>;
      pcVar7 = TemplatedFetchCommitted<duckdb::string_t>;
      pcVar8 = UpdateMergeFetch<duckdb::string_t>;
      break;
    default:
      goto switchD_0178c8fb_caseD_a;
    case UINT128:
      this->initialize_update_function = InitializeUpdateData<duckdb::uhugeint_t>;
      pcVar2 = TemplatedUpdateNumericStatistics<duckdb::uhugeint_t>;
      pcVar3 = RollbackUpdate<duckdb::uhugeint_t>;
      pcVar4 = MergeUpdateLoop<duckdb::uhugeint_t>;
      pcVar5 = TemplatedFetchRow<duckdb::uhugeint_t>;
      pcVar6 = TemplatedFetchCommittedRange<duckdb::uhugeint_t>;
      pcVar7 = TemplatedFetchCommitted<duckdb::uhugeint_t>;
      pcVar8 = UpdateMergeFetch<duckdb::uhugeint_t>;
      break;
    case INT128:
      this->initialize_update_function = InitializeUpdateData<duckdb::hugeint_t>;
      pcVar2 = TemplatedUpdateNumericStatistics<duckdb::hugeint_t>;
      pcVar3 = RollbackUpdate<duckdb::hugeint_t>;
      pcVar4 = MergeUpdateLoop<duckdb::hugeint_t>;
      pcVar5 = TemplatedFetchRow<duckdb::hugeint_t>;
      pcVar6 = TemplatedFetchCommittedRange<duckdb::hugeint_t>;
      pcVar7 = TemplatedFetchCommitted<duckdb::hugeint_t>;
      pcVar8 = UpdateMergeFetch<duckdb::hugeint_t>;
      break;
    case BIT:
      this->initialize_update_function = InitializeUpdateValidity;
      pcVar2 = UpdateValidityStatistics;
      pcVar3 = RollbackUpdate<bool>;
      pcVar4 = MergeValidityLoop;
      pcVar5 = FetchRowValidity;
      pcVar6 = FetchCommittedRangeValidity;
      pcVar7 = FetchCommittedValidity;
      pcVar8 = UpdateMergeValidity;
    }
  }
  this->fetch_update_function = pcVar8;
  this->fetch_committed_function = pcVar7;
  this->fetch_committed_range = pcVar6;
  this->fetch_row_function = pcVar5;
  this->merge_update_function = pcVar4;
  this->rollback_update_function = pcVar3;
  this->statistics_update_function = pcVar2;
  return;
}

Assistant:

UpdateSegment::UpdateSegment(ColumnData &column_data)
    : column_data(column_data), stats(column_data.type), heap(BufferAllocator::Get(column_data.GetDatabase())) {
	auto physical_type = column_data.type.InternalType();

	this->type_size = GetTypeIdSize(physical_type);

	this->initialize_update_function = GetInitializeUpdateFunction(physical_type);
	this->fetch_update_function = GetFetchUpdateFunction(physical_type);
	this->fetch_committed_function = GetFetchCommittedFunction(physical_type);
	this->fetch_committed_range = GetFetchCommittedRangeFunction(physical_type);
	this->fetch_row_function = GetFetchRowFunction(physical_type);
	this->merge_update_function = GetMergeUpdateFunction(physical_type);
	this->rollback_update_function = GetRollbackUpdateFunction(physical_type);
	this->statistics_update_function = GetStatisticsUpdateFunction(physical_type);
}